

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_flushsend(Curl_easy *data,pingpong *pp)

{
  ssize_t sVar1;
  curltime cVar2;
  undefined4 uStack_34;
  long lStack_28;
  CURLcode result;
  ssize_t written;
  pingpong *pp_local;
  Curl_easy *data_local;
  
  written = (ssize_t)pp;
  pp_local = (pingpong *)data;
  data_local._4_4_ =
       Curl_nwrite(data,0,pp->sendthis + (pp->sendsize - pp->sendleft),pp->sendleft,
                   &stack0xffffffffffffffd8);
  sVar1 = written;
  if (data_local._4_4_ == CURLE_OK) {
    if (lStack_28 == *(long *)(written + 0x18)) {
      *(undefined8 *)(written + 0x10) = 0;
      *(undefined8 *)(written + 0x20) = 0;
      *(undefined8 *)(written + 0x18) = 0;
      cVar2 = Curl_now();
      *(time_t *)(sVar1 + 0x28) = cVar2.tv_sec;
      *(ulong *)(sVar1 + 0x30) = CONCAT44(uStack_34,cVar2.tv_usec);
    }
    else {
      *(long *)(written + 0x18) = *(long *)(written + 0x18) - lStack_28;
    }
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pp_flushsend(struct Curl_easy *data,
                           struct pingpong *pp)
{
  /* we have a piece of a command still left to send */
  ssize_t written;
  CURLcode result = Curl_nwrite(data, FIRSTSOCKET,
                                pp->sendthis + pp->sendsize - pp->sendleft,
                                pp->sendleft, &written);
  if(result)
    return result;

  if(written != (ssize_t)pp->sendleft) {
    /* only a fraction was sent */
    pp->sendleft -= written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }
  return CURLE_OK;
}